

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

void __thiscall
t_swift_generator::generate_swift_service_client_async_implementation
          (t_swift_generator *this,ostream *out,t_service *tservice)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar4;
  char *pcVar5;
  pointer pptVar6;
  string error_completion_call;
  string local_a8;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string protocol_name;
  string name;
  
  if (this->gen_cocoa_ == true) {
    generate_old_swift_service_client_async_implementation(this,out,tservice);
    return;
  }
  iVar3 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var,iVar3),"AsyncClient");
  iVar3 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  std::operator+(&protocol_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var_00,iVar3),"Async");
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"extension ");
  poVar4 = std::operator<<(poVar4,(string *)&name);
  poVar4 = std::operator<<(poVar4," : ");
  std::operator<<(poVar4,(string *)&protocol_name);
  block_open(this,out);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&functions,&tservice->functions_)
  ;
  for (pptVar6 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar6 !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    generate_swift_service_client_send_function_implementation(this,out,tservice,*pptVar6,true);
    if ((*pptVar6)->oneway_ == false) {
      generate_swift_service_client_recv_function_implementation(this,out,tservice,*pptVar6,true);
    }
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"public ");
    async_function_signature_abi_cxx11_(&error_completion_call,this,*pptVar6);
    std::operator<<(poVar4,(string *)&error_completion_call);
    std::__cxx11::string::~string((string *)&error_completion_call);
    block_open(this,out);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&error_completion_call,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&error_completion_call);
    poVar4 = std::operator<<(poVar4,"let transport   = factory.newTransport()");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_a8);
    poVar4 = std::operator<<(poVar4,"let proto = Protocol(on: transport)");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&error_completion_call);
    t_generator::indent_abi_cxx11_(&error_completion_call,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&error_completion_call);
    std::operator<<(poVar4,"do");
    std::__cxx11::string::~string((string *)&error_completion_call);
    block_open(this,out);
    generate_swift_service_client_send_async_function_invocation(this,out,*pptVar6);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&error_completion_call,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&error_completion_call);
    poVar4 = std::operator<<(poVar4,"} catch let error {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&error_completion_call);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&error_completion_call,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&error_completion_call);
    poVar4 = std::operator<<(poVar4,"completion(.error(error))");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&error_completion_call);
    block_close(this,out,true);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    iVar3 = (*((*pptVar6)->returntype_->super_t_doc)._vptr_t_doc[4])();
    bVar2 = (*pptVar6)->oneway_;
    std::__cxx11::string::string
              ((string *)&error_completion_call,"completion(.error(error))",(allocator *)&local_a8);
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::operator<<(poVar4,"transport.flush");
    block_open(this,out);
    t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_a8);
    poVar4 = std::operator<<(poVar4,"(trans, error) in");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_a8);
    t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_a8);
    std::operator<<(poVar4,"if let error = error");
    std::__cxx11::string::~string((string *)&local_a8);
    block_open(this,out);
    t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_a8);
    poVar4 = std::operator<<(poVar4,(string *)&error_completion_call);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_a8);
    block_close(this,out,true);
    if (bVar2 == false) {
      t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_a8);
      std::operator<<(poVar4,"do");
      std::__cxx11::string::~string((string *)&local_a8);
      block_open(this,out);
      t_generator::indent((t_generator *)this,out);
      if ((char)iVar3 == '\0') {
        std::operator<<(out,"let result = ");
      }
      poVar4 = std::operator<<(out,"try self.recv_");
      poVar4 = std::operator<<(poVar4,(string *)&(*pptVar6)->name_);
      poVar4 = std::operator<<(poVar4,"(on: proto)");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_a8);
      pcVar5 = "completion(.success(result))";
      if ((char)iVar3 != '\0') {
        pcVar5 = "completion(.success(Void()))";
      }
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_a8);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_a8);
      poVar4 = std::operator<<(poVar4,"} catch let error {");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_a8);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_a8);
      poVar4 = std::operator<<(poVar4,(string *)&error_completion_call);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_a8);
      block_close(this,out,true);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_a8);
      poVar4 = std::operator<<(poVar4,"completion(.success(Void()))");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    block_close(this,out,true);
    block_close(this,out,true);
    std::__cxx11::string::~string((string *)&error_completion_call);
  }
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>);
  std::__cxx11::string::~string((string *)&protocol_name);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void t_swift_generator::generate_swift_service_client_async_implementation(ostream& out, t_service* tservice) {
  if (gen_cocoa_) {
    generate_old_swift_service_client_async_implementation(out, tservice);
    return;
  }
  string name = tservice->get_name() + "AsyncClient";
  string protocol_name = tservice->get_name() + "Async";

  indent(out) << "extension " << name << " : " << protocol_name;
  block_open(out);
  out << endl;

  // generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {

    generate_swift_service_client_send_function_implementation(out, tservice, *f_iter, true);

    if (!(*f_iter)->is_oneway()) {
      generate_swift_service_client_recv_function_implementation(out, tservice, *f_iter, true);
    }

    indent(out) << "public " << async_function_signature(*f_iter);
    block_open(out);
    out << endl;
    out << indent() << "let transport   = factory.newTransport()" << endl
        << indent() << "let proto = Protocol(on: transport)" << endl
        << endl;

    out << indent() << "do";
    block_open(out);

    generate_swift_service_client_send_async_function_invocation(out, *f_iter);

    indent_down();
    out << indent() << "} catch let error {" << endl;
    indent_up();
    out << indent() << "completion(.error(error))" << endl;
    block_close(out);

    out << endl;

    bool ret_is_void = (*f_iter)->get_returntype()->is_void();
    bool is_oneway = (*f_iter)->is_oneway();

    string error_completion_call = "completion(.error(error))";
    indent(out) << "transport.flush";
    block_open(out);
    out << indent() << "(trans, error) in" << endl << endl;
    out << indent() << "if let error = error";
    block_open(out);
    out << indent() << error_completion_call << endl;
    block_close(out);

    if (!is_oneway) {
      out << indent() << "do";
      block_open(out);
      indent(out);
      if (!ret_is_void) {
        out << "let result = ";
      }
      out << "try self.recv_" << (*f_iter)->get_name() << "(on: proto)" << endl;

      out << indent() << (ret_is_void ? "completion(.success(Void()))" : "completion(.success(result))") << endl;
      indent_down();
      out << indent() << "} catch let error {" << endl;
      indent_up();
      out << indent() << error_completion_call << endl;

      block_close(out);
    } else {
      out << indent() << "completion(.success(Void()))" << endl;
    }
    block_close(out);
    block_close(out);

  }
  block_close(out);
  out << endl;
}